

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

int fmt::v10::detail::count_digits<3,unsigned_long>(unsigned_long n)

{
  int iVar1;
  anon_class_1_0_00000001 local_11;
  unsigned_long local_10;
  unsigned_long n_local;
  
  local_10 = n;
  iVar1 = count_digits<3,_unsigned_long>::anon_class_1_0_00000001::operator()(&local_11,n);
  return iVar1;
}

Assistant:

FMT_CONSTEXPR auto count_digits(UInt n) -> int {
#ifdef FMT_BUILTIN_CLZ
  if (!is_constant_evaluated() && num_bits<UInt>() == 32)
    return (FMT_BUILTIN_CLZ(static_cast<uint32_t>(n) | 1) ^ 31) / BITS + 1;
#endif
  // Lambda avoids unreachable code warnings from NVHPC.
  return [](UInt m) {
    int num_digits = 0;
    do {
      ++num_digits;
    } while ((m >>= BITS) != 0);
    return num_digits;
  }(n);
}